

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::anon_unknown_6::ScanLineProcess::update_pointers
          (ScanLineProcess *this,FrameBuffer *outfb,int fbY,int fbLastY)

{
  undefined8 *puVar1;
  int iVar2;
  PixelType PVar3;
  exr_coding_channel_info_t *peVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  Slice *pSVar8;
  long lVar9;
  
  iVar2 = (this->cinfo).start_y;
  (this->decoder).user_line_begin_skip = fbY - iVar2;
  (this->decoder).user_line_end_ignore = 0;
  lVar7 = (long)iVar2 + (long)(this->cinfo).height + -1;
  if (fbLastY < lVar7) {
    (this->decoder).user_line_end_ignore = (int)lVar7 - fbLastY;
  }
  if (0 < (this->decoder).channel_count) {
    lVar7 = 0x28;
    lVar9 = 0;
    do {
      peVar4 = (this->decoder).channels;
      pSVar8 = FrameBuffer::findSlice(outfb,*(char **)((long)peVar4 + lVar7 + -0x28));
      if ((pSVar8 == (Slice *)0x0) || (*(int *)((long)peVar4 + lVar7 + -0x20) == 0)) {
        puVar1 = (undefined8 *)((long)peVar4 + lVar7 + -8);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      else {
        PVar3 = pSVar8->type;
        *(ushort *)((long)peVar4 + lVar7 + -0xc) = (ushort)(PVar3 != HALF) * 2 + 2;
        *(short *)((long)peVar4 + lVar7 + -10) = (short)PVar3;
        sVar5 = pSVar8->xStride;
        *(int *)((long)peVar4 + lVar7 + -8) = (int)sVar5;
        sVar6 = pSVar8->yStride;
        *(int *)((long)peVar4 + lVar7 + -4) = (int)sVar6;
        *(char **)((long)&peVar4->channel_name + lVar7) =
             pSVar8->base +
             (long)(fbY / pSVar8->ySampling) * sVar6 +
             (long)((this->cinfo).start_x / pSVar8->xSampling) * sVar5;
      }
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 0x30;
    } while (lVar9 < (this->decoder).channel_count);
  }
  return;
}

Assistant:

void ScanLineProcess::update_pointers (
    const FrameBuffer *outfb, int fbY, int fbLastY)
{
    decoder.user_line_begin_skip = fbY - cinfo.start_y;
    decoder.user_line_end_ignore = 0;
    int64_t endY = (int64_t)cinfo.start_y + (int64_t)cinfo.height - 1;
    if ((int64_t)fbLastY < endY)
        decoder.user_line_end_ignore = (int32_t)(endY - fbLastY);

    for (int c = 0; c < decoder.channel_count; ++c)
    {
        exr_coding_channel_info_t& curchan = decoder.channels[c];
        uint8_t*                   ptr;
        const Slice*               fbslice;

        fbslice = outfb->findSlice (curchan.channel_name);

        if (curchan.height == 0 || !fbslice)
        {
            curchan.decode_to_ptr     = NULL;
            curchan.user_pixel_stride = 0;
            curchan.user_line_stride  = 0;
            continue;
        }

        curchan.user_bytes_per_element = (fbslice->type == HALF) ? 2 : 4;
        curchan.user_data_type         = (exr_pixel_type_t)fbslice->type;
        curchan.user_pixel_stride      = fbslice->xStride;
        curchan.user_line_stride       = fbslice->yStride;

        ptr  = reinterpret_cast<uint8_t*> (fbslice->base);
        ptr += int64_t (cinfo.start_x / fbslice->xSampling) * int64_t (fbslice->xStride);
        ptr += int64_t (fbY / fbslice->ySampling) * int64_t (fbslice->yStride);

        curchan.decode_to_ptr = ptr;
    }
}